

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_container_rank(array_container_t *arr,uint16_t x)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = binarySearch(arr->array,arr->cardinality,x);
  uVar2 = ~uVar1;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

inline int array_container_rank(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx + 1;
    } else {
        return -idx - 1;
    }
}